

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::clara::TextFlow::Column::iterator::operator*[abi_cxx11_
          (string *__return_storage_ptr__,iterator *this)

{
  pointer pbVar1;
  string sStack_38;
  
  pbVar1 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_column->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
      this->m_stringIndex) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Taywee[P]args/catch.hpp",0x217f
                  ,"std::string Catch::clara::TextFlow::Column::iterator::operator*() const");
  }
  if (this->m_pos <= this->m_end) {
    std::__cxx11::string::substr((ulong)&sStack_38,(ulong)(pbVar1 + this->m_stringIndex));
    addIndentAndSuffix(__return_storage_ptr__,this,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    return __return_storage_ptr__;
  }
  __assert_fail("m_pos <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/Taywee[P]args/catch.hpp",0x2180,
                "std::string Catch::clara::TextFlow::Column::iterator::operator*() const");
}

Assistant:

auto operator *() const -> std::string {
			assert(m_stringIndex < m_column.m_strings.size());
			assert(m_pos <= m_end);
			return addIndentAndSuffix(line().substr(m_pos, m_len));
		}